

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perfect.hpp
# Opt level: O0

Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
 Lib::
 perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>
           (MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *t)

{
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *extraout_RDX;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_RDI;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  PVar1;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_00000018;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  *in_stack_00000020;
  
  Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::MonomFactors
            (in_RDI,in_RDI);
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  ::Perfect(in_stack_00000020,in_stack_00000018);
  Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::~MonomFactors
            ((MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x378564);
  PVar1._ptr = extraout_RDX;
  PVar1._0_8_ = in_RDI;
  return PVar1;
}

Assistant:

Perfect<T, Cmp> perfect(T t) 
{ return Perfect<T, Cmp>(std::move(t)); }